

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestCommand.cxx
# Opt level: O0

cmCTestGenericHandler * __thiscall cmCTestTestCommand::InitializeHandler(cmCTestTestCommand *this)

{
  cmMakefile *pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  undefined4 extraout_var;
  reference ppcVar6;
  ostream *poVar7;
  allocator<char> local_781;
  string local_780;
  char *local_760;
  char *labelsForSubprojects;
  ostringstream local_738 [8];
  ostringstream cmCTestLog_msg_1;
  string local_5c0 [32];
  ostringstream local_5a0 [8];
  ostringstream cmCTestLog_msg;
  allocator<char> local_421;
  string local_420;
  char *local_400;
  char *ctestTestLoad;
  unsigned_long testLoad;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2d1;
  string local_2d0;
  allocator<char> local_2a9;
  string local_2a8;
  allocator<char> local_281;
  string local_280;
  string local_260 [39];
  allocator<char> local_239;
  string local_238;
  undefined1 local_218 [8];
  ostringstream testsToRunString;
  cmCTestGenericHandler *handler;
  int local_8c;
  duration<long,_std::ratio<60L,_1L>_> local_88;
  rep_conflict local_80;
  duration<double,_std::ratio<1L,_1L>_> local_78;
  rep_conflict local_70;
  double local_68;
  rep_conflict local_60;
  duration<double,_std::ratio<1L,_1L>_> local_58;
  cmDuration timeout;
  allocator<char> local_39;
  string local_38;
  char *local_18;
  char *ctestTimeout;
  cmCTestTestCommand *this_local;
  cmCTestGenericHandler *this_00;
  
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  ctestTimeout = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"CTEST_TEST_TIMEOUT",&local_39);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  local_18 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    local_70 = (rep_conflict)
               cmCTest::GetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    local_58.__r = local_70;
    local_78 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::zero();
    bVar3 = std::chrono::operator<=(&local_58,&local_78);
    if (bVar3) {
      local_8c = 10;
      std::chrono::duration<long,std::ratio<60l,1l>>::duration<int,void>
                ((duration<long,std::ratio<60l,1l>> *)&local_88,&local_8c);
      std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<60l,1l>,void>
                ((duration<double,std::ratio<1l,1l>> *)&local_80,&local_88);
      local_58.__r = local_80;
    }
  }
  else {
    local_68 = atof(pcVar5);
    std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
              ((duration<double,std::ratio<1l,1l>> *)&local_60,&local_68);
    local_58.__r = local_60;
  }
  cmCTest::SetTimeOut((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,
                      (cmDuration)local_58.__r);
  iVar4 = (*(this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand._vptr_cmCommand
            [0xc])();
  this_00 = (cmCTestGenericHandler *)CONCAT44(extraout_var,iVar4);
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,8);
  if (((*ppcVar6 != (value_type)0x0) ||
      (ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                           (&(this->super_cmCTestHandlerCommand).Values,9),
      *ppcVar6 != (value_type)0x0)) ||
     (ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,10),
     *ppcVar6 != (value_type)0x0)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,8);
    if (*ppcVar6 != (value_type)0x0) {
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,8);
      std::operator<<((ostream *)local_218,*ppcVar6);
    }
    std::operator<<((ostream *)local_218,",");
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,9);
    if (*ppcVar6 != (value_type)0x0) {
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,9);
      std::operator<<((ostream *)local_218,*ppcVar6);
    }
    std::operator<<((ostream *)local_218,",");
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,10);
    if (*ppcVar6 != (value_type)0x0) {
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,10);
      std::operator<<((ostream *)local_218,*ppcVar6);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"TestsToRunInformation",&local_239);
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCTestGenericHandler::SetOption(this_00,&local_238,pcVar5);
    std::__cxx11::string::~string(local_260);
    std::__cxx11::string::~string((string *)&local_238);
    std::allocator<char>::~allocator(&local_239);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0xb);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"ExcludeRegularExpression",&local_281);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0xb);
    cmCTestGenericHandler::SetOption(this_00,&local_280,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_280);
    std::allocator<char>::~allocator(&local_281);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0xc);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a8,"IncludeRegularExpression",&local_2a9);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0xc);
    cmCTestGenericHandler::SetOption(this_00,&local_2a8,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_2a8);
    std::allocator<char>::~allocator(&local_2a9);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0xd);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,"ExcludeLabelRegularExpression",&local_2d1);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0xd);
    cmCTestGenericHandler::SetOption(this_00,&local_2d0,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::allocator<char>::~allocator(&local_2d1);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0xe);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2f8,"LabelRegularExpression",&local_2f9);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0xe);
    cmCTestGenericHandler::SetOption(this_00,&local_2f8,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::allocator<char>::~allocator(&local_2f9);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0xf);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"ExcludeFixtureRegularExpression",&local_321);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0xf);
    cmCTestGenericHandler::SetOption(this_00,&local_320,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_320);
    std::allocator<char>::~allocator(&local_321);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0x10);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_348,"ExcludeFixtureSetupRegularExpression",&local_349);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0x10);
    cmCTestGenericHandler::SetOption(this_00,&local_348,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_348);
    std::allocator<char>::~allocator(&local_349);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0x11);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,"ExcludeFixtureCleanupRegularExpression",&local_371);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0x11);
    cmCTestGenericHandler::SetOption(this_00,&local_370,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0x12);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"ParallelLevel",&local_399);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0x12);
    cmCTestGenericHandler::SetOption(this_00,&local_398,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_398);
    std::allocator<char>::~allocator(&local_399);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0x13);
  if (*ppcVar6 != (value_type)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3c0,"ScheduleRandom",&local_3c1);
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0x13);
    cmCTestGenericHandler::SetOption(this_00,&local_3c0,*ppcVar6);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::allocator<char>::~allocator(&local_3c1);
  }
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0x14);
  if (*ppcVar6 != (value_type)0x0) {
    pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0x14);
    pcVar5 = *ppcVar6;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e8,pcVar5,(allocator<char> *)((long)&testLoad + 7));
    cmCTest::SetStopTime(pcVar2,&local_3e8);
    std::__cxx11::string::~string((string *)&local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)((long)&testLoad + 7));
  }
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_420,"CTEST_TEST_LOAD",&local_421);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  local_400 = pcVar5;
  ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                      (&(this->super_cmCTestHandlerCommand).Values,0x15);
  if ((*ppcVar6 == (value_type)0x0) ||
     (ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,0x15), **ppcVar6 == '\0')) {
    if ((local_400 == (char *)0x0) || (*local_400 == '\0')) {
      ctestTestLoad =
           (char *)cmCTest::GetTestLoad
                             ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest);
    }
    else {
      bVar3 = cmSystemTools::StringToULong(local_400,(unsigned_long *)&ctestTestLoad);
      if (!bVar3) {
        ctestTestLoad = (char *)0x0;
        std::__cxx11::ostringstream::ostringstream(local_738);
        poVar7 = std::operator<<((ostream *)local_738,"Invalid value for \'CTEST_TEST_LOAD\' : ");
        poVar7 = std::operator<<(poVar7,local_400);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                     ,0x7c,pcVar5,false);
        std::__cxx11::string::~string((string *)&labelsForSubprojects);
        std::__cxx11::ostringstream::~ostringstream(local_738);
      }
    }
  }
  else {
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        (&(this->super_cmCTestHandlerCommand).Values,0x15);
    bVar3 = cmSystemTools::StringToULong(*ppcVar6,(unsigned_long *)&ctestTestLoad);
    if (!bVar3) {
      ctestTestLoad = (char *)0x0;
      std::__cxx11::ostringstream::ostringstream(local_5a0);
      poVar7 = std::operator<<((ostream *)local_5a0,"Invalid value for \'TEST_LOAD\' : ");
      ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                          (&(this->super_cmCTestHandlerCommand).Values,0x15);
      poVar7 = std::operator<<(poVar7,*ppcVar6);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      pcVar2 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CTest/cmCTestTestCommand.cxx"
                   ,0x75,pcVar5,false);
      std::__cxx11::string::~string(local_5c0);
      std::__cxx11::ostringstream::~ostringstream(local_5a0);
    }
  }
  cmCTestGenericHandler::SetTestLoad(this_00,(unsigned_long)ctestTestLoad);
  pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_780,"CTEST_LABELS_FOR_SUBPROJECTS",&local_781);
  pcVar5 = cmMakefile::GetDefinition(pcVar1,&local_780);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  local_760 = pcVar5;
  if (pcVar5 != (char *)0x0) {
    cmCTest::SetCTestConfiguration
              ((this->super_cmCTestHandlerCommand).super_cmCTestCommand.CTest,"LabelsForSubprojects"
               ,pcVar5,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  }
  cmCTestGenericHandler::SetQuiet(this_00,(bool)((this->super_cmCTestHandlerCommand).Quiet & 1));
  return this_00;
}

Assistant:

cmCTestGenericHandler* cmCTestTestCommand::InitializeHandler()
{
  const char* ctestTimeout =
    this->Makefile->GetDefinition("CTEST_TEST_TIMEOUT");

  cmDuration timeout;
  if (ctestTimeout) {
    timeout = cmDuration(atof(ctestTimeout));
  } else {
    timeout = this->CTest->GetTimeOut();
    if (timeout <= cmDuration::zero()) {
      // By default use timeout of 10 minutes
      timeout = std::chrono::minutes(10);
    }
  }
  this->CTest->SetTimeOut(timeout);
  cmCTestGenericHandler* handler = this->InitializeActualHandler();
  if (this->Values[ctt_START] || this->Values[ctt_END] ||
      this->Values[ctt_STRIDE]) {
    std::ostringstream testsToRunString;
    if (this->Values[ctt_START]) {
      testsToRunString << this->Values[ctt_START];
    }
    testsToRunString << ",";
    if (this->Values[ctt_END]) {
      testsToRunString << this->Values[ctt_END];
    }
    testsToRunString << ",";
    if (this->Values[ctt_STRIDE]) {
      testsToRunString << this->Values[ctt_STRIDE];
    }
    handler->SetOption("TestsToRunInformation",
                       testsToRunString.str().c_str());
  }
  if (this->Values[ctt_EXCLUDE]) {
    handler->SetOption("ExcludeRegularExpression", this->Values[ctt_EXCLUDE]);
  }
  if (this->Values[ctt_INCLUDE]) {
    handler->SetOption("IncludeRegularExpression", this->Values[ctt_INCLUDE]);
  }
  if (this->Values[ctt_EXCLUDE_LABEL]) {
    handler->SetOption("ExcludeLabelRegularExpression",
                       this->Values[ctt_EXCLUDE_LABEL]);
  }
  if (this->Values[ctt_INCLUDE_LABEL]) {
    handler->SetOption("LabelRegularExpression",
                       this->Values[ctt_INCLUDE_LABEL]);
  }
  if (this->Values[ctt_EXCLUDE_FIXTURE]) {
    handler->SetOption("ExcludeFixtureRegularExpression",
                       this->Values[ctt_EXCLUDE_FIXTURE]);
  }
  if (this->Values[ctt_EXCLUDE_FIXTURE_SETUP]) {
    handler->SetOption("ExcludeFixtureSetupRegularExpression",
                       this->Values[ctt_EXCLUDE_FIXTURE_SETUP]);
  }
  if (this->Values[ctt_EXCLUDE_FIXTURE_CLEANUP]) {
    handler->SetOption("ExcludeFixtureCleanupRegularExpression",
                       this->Values[ctt_EXCLUDE_FIXTURE_CLEANUP]);
  }
  if (this->Values[ctt_PARALLEL_LEVEL]) {
    handler->SetOption("ParallelLevel", this->Values[ctt_PARALLEL_LEVEL]);
  }
  if (this->Values[ctt_SCHEDULE_RANDOM]) {
    handler->SetOption("ScheduleRandom", this->Values[ctt_SCHEDULE_RANDOM]);
  }
  if (this->Values[ctt_STOP_TIME]) {
    this->CTest->SetStopTime(this->Values[ctt_STOP_TIME]);
  }

  // Test load is determined by: TEST_LOAD argument,
  // or CTEST_TEST_LOAD script variable, or ctest --test-load
  // command line argument... in that order.
  unsigned long testLoad;
  const char* ctestTestLoad = this->Makefile->GetDefinition("CTEST_TEST_LOAD");
  if (this->Values[ctt_TEST_LOAD] && *this->Values[ctt_TEST_LOAD]) {
    if (!cmSystemTools::StringToULong(this->Values[ctt_TEST_LOAD],
                                      &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'TEST_LOAD' : "
                   << this->Values[ctt_TEST_LOAD] << std::endl);
    }
  } else if (ctestTestLoad && *ctestTestLoad) {
    if (!cmSystemTools::StringToULong(ctestTestLoad, &testLoad)) {
      testLoad = 0;
      cmCTestLog(this->CTest, WARNING,
                 "Invalid value for 'CTEST_TEST_LOAD' : " << ctestTestLoad
                                                          << std::endl);
    }
  } else {
    testLoad = this->CTest->GetTestLoad();
  }
  handler->SetTestLoad(testLoad);

  if (const char* labelsForSubprojects =
        this->Makefile->GetDefinition("CTEST_LABELS_FOR_SUBPROJECTS")) {
    this->CTest->SetCTestConfiguration("LabelsForSubprojects",
                                       labelsForSubprojects, this->Quiet);
  }

  handler->SetQuiet(this->Quiet);
  return handler;
}